

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-default-ecc-impl.c
# Opt level: O0

int ndn_lite_default_ecdsa_sign
              (uint8_t *input_value,uint32_t input_size,uint8_t *output_value,
              uint32_t output_max_size,abstract_ecc_prv_key *abs_key,uint8_t ecdsa_type,
              uint32_t *output_used_size)

{
  int iVar1;
  uint32_t local_16c;
  int ret_val;
  uint32_t encoded_sig_length;
  uECC_SHA256_HashContext *ctx;
  uECC_SHA256_HashContext HashContext;
  uint8_t tmp [128];
  int ecc_sign_result;
  uint32_t signature_size;
  uint8_t ecdsa_type_local;
  abstract_ecc_prv_key *abs_key_local;
  uint32_t output_max_size_local;
  uint8_t *output_value_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  
  if (output_max_size < 0x40) {
    input_value_local._4_4_ = -10;
  }
  else if (abs_key->key_size < 0x21) {
    if (ecdsa_type == ' ') {
      _ret_val = (uECC_HashContext *)&ctx;
      ctx = (uECC_SHA256_HashContext *)_init_sha256;
      HashContext.uECC.init_hash = _update_sha256;
      HashContext.uECC.update_hash = _finish_sha256;
      HashContext.uECC.finish_hash._0_4_ = 0x40;
      HashContext.uECC.finish_hash._4_4_ = 0x20;
      HashContext.uECC._24_8_ = &HashContext.ctx.leftover_offset;
      iVar1 = uECC_sign_deterministic(abs_key->key_value,input_value,_ret_val,output_value);
      if (iVar1 == 0) {
        input_value_local._4_4_ = -0x19;
      }
      else {
        input_value_local._4_4_ =
             ndn_asn1_probe_ecdsa_signature_encoding_size(output_value,0x40,&local_16c);
        if ((input_value_local._4_4_ == 0) &&
           (input_value_local._4_4_ =
                 ndn_asn1_encode_ecdsa_signature(output_value,0x40,output_max_size),
           input_value_local._4_4_ == 0)) {
          *output_used_size = local_16c;
          input_value_local._4_4_ = 0;
        }
      }
    }
    else {
      input_value_local._4_4_ = -0x1a;
    }
  }
  else {
    input_value_local._4_4_ = -0x16;
  }
  return input_value_local._4_4_;
}

Assistant:

int
ndn_lite_default_ecdsa_sign(const uint8_t* input_value, uint32_t input_size,
                            uint8_t* output_value, uint32_t output_max_size,
                            const struct abstract_ecc_prv_key* abs_key,
                            uint8_t ecdsa_type, uint32_t* output_used_size)
{
  if (output_max_size < NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE)
    return NDN_OVERSIZE;
  if (abs_key->key_size > NDN_SEC_ECC_SECP256R1_PRIVATE_KEY_SIZE)
    return NDN_SEC_WRONG_KEY_SIZE;
  if (ecdsa_type != NDN_ECDSA_CURVE_SECP256R1)
    return NDN_SEC_UNSUPPORT_CRYPTO_ALGO;

  uint32_t signature_size = NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE;
  int ecc_sign_result = 0;

#ifndef FEATURE_PERIPH_HWRNG
  uint8_t tmp[NDN_SEC_ECC_SECP256R1_PRIVATE_KEY_SIZE +
              NDN_SEC_ECC_SECP256R1_PRIVATE_KEY_SIZE +
              NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE];
  uECC_SHA256_HashContext HashContext;
  uECC_SHA256_HashContext* ctx = &HashContext;
  ctx->uECC.init_hash = &_init_sha256;
  ctx->uECC.update_hash = &_update_sha256;
  ctx->uECC.finish_hash = &_finish_sha256;
  ctx->uECC.block_size = NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE;
  ctx->uECC.result_size = NDN_SEC_ECC_SECP256R1_PRIVATE_KEY_SIZE;
  ctx->uECC.tmp = tmp;

  ecc_sign_result = uECC_sign_deterministic(abs_key->key_value, input_value,
                                            &ctx->uECC, output_value);
#else
  ecc_sign_result = uECC_sign(abs_key->key_value, input_value, output_value);
#endif
  if (ecc_sign_result == 0) {
    return NDN_SEC_CRYPTO_ALGO_FAILURE;
  }

  uint32_t encoded_sig_length;
  int ret_val = ndn_asn1_probe_ecdsa_signature_encoding_size(output_value, signature_size,
                                                             &encoded_sig_length);
  if (ret_val != NDN_SUCCESS) {
    return ret_val;
  }

  ret_val = ndn_asn1_encode_ecdsa_signature(output_value, signature_size, output_max_size);
  if (ret_val != NDN_SUCCESS) {
    return ret_val;
  }

  *output_used_size = encoded_sig_length;

  return NDN_SUCCESS;
}